

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

void __thiscall
QVLABase<double>::resize_impl(QVLABase<double> *this,qsizetype prealloc,void *array,qsizetype sz)

{
  long aalloc;
  
  aalloc = (this->super_QVLABaseBase).a;
  if (aalloc <= sz) {
    aalloc = sz;
  }
  reallocate_impl(this,prealloc,array,sz,aalloc);
  (this->super_QVLABaseBase).s = sz;
  return;
}

Assistant:

void resize_impl(qsizetype prealloc, void *array, qsizetype sz)
    {
        reallocate_impl(prealloc, array, sz, qMax(sz, capacity()));
        if constexpr (QTypeInfo<T>::isComplex) {
            // call default constructor for new objects (which can throw)
            while (size() < sz) {
                q20::construct_at(data() + size());
                ++s;
            }
        } else {
            s = sz;
        }
    }